

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_combo_begin(nk_context *ctx,nk_window *win,nk_vec2 size,nk_bool is_clicked,nk_rect header
                      )

{
  int iVar1;
  nk_rect header_00;
  nk_rect body_00;
  nk_bool nVar2;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  bool bVar3;
  bool bVar4;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  nk_hash hash;
  nk_rect body;
  int is_active;
  int is_open;
  nk_window *popup;
  long lVar5;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 local_30;
  undefined4 uVar6;
  float in_stack_ffffffffffffffe0;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  float fVar10;
  nk_bool local_4;
  
  uVar7 = (undefined4)in_XMM1_Qa;
  uVar8 = (undefined4)((ulong)in_XMM1_Qa >> 0x20);
  uVar9 = (undefined4)in_XMM2_Qa;
  fVar10 = (float)((ulong)in_XMM2_Qa >> 0x20);
  local_30 = (undefined4)in_RSI;
  uVar6 = (undefined4)((ulong)in_RSI >> 0x20);
  if (((in_RDI == 0) || (*(long *)(in_RDI + 0x40d8) == 0)) ||
     (*(long *)(*(long *)(in_RDI + 0x40d8) + 0xa8) == 0)) {
    local_4 = 0;
  }
  else {
    lVar5 = *(long *)(in_RSI + 0x120);
    iVar1 = *(int *)(in_RSI + 0x160);
    *(int *)(in_RSI + 0x160) = iVar1 + 1;
    bVar3 = lVar5 != 0;
    bVar4 = false;
    if ((lVar5 != 0) && (bVar4 = false, *(int *)(in_RSI + 0x158) == iVar1)) {
      bVar4 = *(int *)(in_RSI + 0x128) == 0x20;
    }
    if (((((in_EDX != 0) && (bVar3)) && (!bVar4)) || ((bVar3 && (!bVar4)))) ||
       ((!bVar3 && ((!bVar4 && (in_EDX == 0)))))) {
      local_4 = 0;
    }
    else {
      if ((in_EDX != 0) && (bVar3)) {
        nk_rect(0.0,0.0,0.0,0.0);
      }
      body_00.y = (float)uVar8;
      body_00.x = (float)uVar7;
      body_00.w = (float)uVar9;
      body_00.h = fVar10;
      header_00.y = (float)(int)in_RDI;
      header_00.w = (float)(int)((ulong)in_RDI >> 0x20);
      header_00.x = (float)uVar6;
      header_00.h = in_stack_ffffffffffffffe0;
      nVar2 = nk_nonblock_begin((nk_context *)CONCAT44(in_EDX,in_stack_ffffffffffffffc8),
                                (nk_flags)((ulong)lVar5 >> 0x20),body_00,header_00,
                                (nk_panel_type)lVar5);
      if (nVar2 == 0) {
        local_4 = 0;
      }
      else {
        *(undefined4 *)(CONCAT44(uVar6,local_30) + 0x128) = 0x20;
        *(int *)(CONCAT44(uVar6,local_30) + 0x158) = iVar1;
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

NK_INTERN nk_bool
nk_combo_begin(struct nk_context *ctx, struct nk_window *win,
struct nk_vec2 size, nk_bool is_clicked, struct nk_rect header)
{
struct nk_window *popup;
int is_open = 0;
int is_active = 0;
struct nk_rect body;
nk_hash hash;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return 0;

popup = win->popup.win;
body.x = header.x;
body.w = size.x;
body.y = header.y + header.h-ctx->style.window.combo_border;
body.h = size.y;

hash = win->popup.combo_count++;
is_open = (popup) ? nk_true:nk_false;
is_active = (popup && (win->popup.name == hash) && win->popup.type == NK_PANEL_COMBO);
if ((is_clicked && is_open && !is_active) || (is_open && !is_active) ||
(!is_open && !is_active && !is_clicked)) return 0;
if (!nk_nonblock_begin(ctx, 0, body,
(is_clicked && is_open)?nk_rect(0,0,0,0):header, NK_PANEL_COMBO)) return 0;

win->popup.type = NK_PANEL_COMBO;
win->popup.name = hash;
return 1;
}